

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3d.h
# Opt level: O2

bool __thiscall irr::core::vector3d<float>::equals(vector3d<float> *this,vector3d<float> *other)

{
  if ((ABS(this->X - other->X) <= 1e-06) && (ABS(this->Y - other->Y) <= 1e-06)) {
    return ABS(this->Z - other->Z) <= 1e-06;
  }
  return false;
}

Assistant:

bool equals(const vector3d<T> &other) const
	{
		return core::equals(X, other.X) && core::equals(Y, other.Y) && core::equals(Z, other.Z);
	}